

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void proto2_unittest::RepeatedGroup_extension_lite::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Nullable<const_char_*> failure_msg;
  RepeatedGroup_extension_lite *_this;
  RepeatedGroup_extension_lite *local_20;
  LogMessageFatal local_18;
  
  local_20 = (RepeatedGroup_extension_lite *)to_msg;
  local_18.super_LogMessage._0_8_ = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<proto2_unittest::RepeatedGroup_extension_lite_const*,proto2_unittest::RepeatedGroup_extension_lite*>
                          ((RepeatedGroup_extension_lite **)&local_18,&local_20,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 1) != 0) {
      *(int *)((long)&local_20->field_0 + 8) = (int)from_msg[1]._internal_metadata_.ptr_;
    }
    (local_20->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_20->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
              (&(local_20->super_MessageLite)._internal_metadata_,&from_msg->_internal_metadata_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
             ,0x1820,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

void RepeatedGroup_extension_lite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<RepeatedGroup_extension_lite*>(&to_msg);
  auto& from = static_cast<const RepeatedGroup_extension_lite&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.RepeatedGroup_extension_lite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_impl_.a_ = from._impl_.a_;
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}